

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void sendOneToEachReaderRank(SstStream Stream,CMFormat f,void *Msg,void **RS_StreamPtr)

{
  WS_ReaderInfo CP_WSR_Stream;
  int i;
  ulong uVar1;
  
  for (uVar1 = 0; (long)uVar1 < (long)Stream->ReaderCount; uVar1 = uVar1 + 1) {
    CP_WSR_Stream = Stream->Readers[uVar1];
    if (CP_WSR_Stream->ReaderStatus == Established) {
      CP_verbose(Stream,TraceVerbose,"Working on reader cohort %d\n",uVar1 & 0xffffffff);
      sendOneToWSRCohort(CP_WSR_Stream,f,Msg,RS_StreamPtr);
    }
    else {
      CP_verbose(Stream,TraceVerbose,"Skipping reader cohort %d\n",uVar1 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void sendOneToEachReaderRank(SstStream Stream, CMFormat f, void *Msg, void **RS_StreamPtr)
{
    STREAM_ASSERT_LOCKED(Stream);
    for (int i = 0; i < Stream->ReaderCount; i++)
    {
        WS_ReaderInfo CP_WSR_Stream = Stream->Readers[i];
        if (CP_WSR_Stream->ReaderStatus == Established)
        {
            CP_verbose(Stream, TraceVerbose, "Working on reader cohort %d\n", i);
        }
        else
        {
            CP_verbose(Stream, TraceVerbose, "Skipping reader cohort %d\n", i);
            continue;
        }
        sendOneToWSRCohort(CP_WSR_Stream, f, Msg, RS_StreamPtr);
    }
}